

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O3

bool __thiscall ConnectFourState::has_moves(ConnectFourState *this)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  if (1 < this->player_to_move - 1U) {
    MCTS::assertion_failed
              ("player_to_move == 1 || player_to_move == 2",
               "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/connect_four.h"
               ,0xc4);
  }
  cVar1 = get_winner(this);
  if ((cVar1 == '.') && (0 < (long)this->num_cols)) {
    lVar2 = 0;
    do {
      bVar3 = *(char *)(*(long *)&(((this->board).
                                    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data + lVar2) == '.';
      if (bVar3) {
        return bVar3;
      }
      bVar4 = (long)this->num_cols + -1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar4);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

void check_invariant() const
	{
		attest(player_to_move == 1 || player_to_move == 2);
	}